

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qibusproxy.h
# Opt level: O2

QIBusProxy * __thiscall QIBusProxy::GetProperty(QIBusProxy *this,QString method)

{
  char cVar1;
  QDBusMessage *this_00;
  QString *in_RDX;
  long in_FS_OFFSET;
  QDBusMessage msg;
  QArrayDataPointer<char16_t> local_e8;
  QArrayDataPointer<char16_t> local_d0;
  QArrayDataPointer<char16_t> local_b8;
  undefined8 local_a0;
  QVariant local_98;
  QVariant local_78 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QDBusAbstractInterface::isValid();
  if (cVar1 != '\0') {
    QDBusAbstractInterface::service();
    if (local_78[0].d.data._16_8_ == 0) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
    }
    else {
      QDBusAbstractInterface::path();
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
      if (local_98.d.data._16_8_ != 0) {
        local_a0 = 0xaaaaaaaaaaaaaaaa;
        QDBusAbstractInterface::service();
        QDBusAbstractInterface::path();
        dbusInterfaceProperties();
        local_d0.d = (Data *)0x0;
        local_e8.d = (Data *)0x0;
        local_e8.ptr = (char16_t *)0x0;
        local_d0.ptr = L"Get";
        local_e8.size = 0;
        local_d0.size = 3;
        QDBusMessage::createMethodCall
                  ((QString *)&local_a0,(QString *)local_78,(QString *)&local_98,
                   (QString *)&local_b8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
        QDBusAbstractInterface::interface();
        QVariant::QVariant(local_78,(QString *)&local_b8);
        this_00 = (QDBusMessage *)QDBusMessage::operator<<((QDBusMessage *)&local_a0,local_78);
        QVariant::QVariant(&local_98,in_RDX);
        QDBusMessage::operator<<(this_00,&local_98);
        QVariant::~QVariant(&local_98);
        QVariant::~QVariant(local_78);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
        QDBusAbstractInterface::connection();
        QDBusAbstractInterface::timeout();
        QDBusConnection::asyncCall((QDBusMessage *)this,(int)(QDBusConnection *)local_78);
        QDBusConnection::~QDBusConnection((QDBusConnection *)local_78);
        QDBusMessage::~QDBusMessage((QDBusMessage *)&local_a0);
        goto LAB_001186fb;
      }
    }
  }
  QDBusAbstractInterface::lastError();
  QDBusPendingCall::fromError((QDBusError *)this);
  QDBusError::~QDBusError((QDBusError *)local_78);
LAB_001186fb:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

inline QDBusPendingCall GetProperty(const QString method)
    {
        if (!this->isValid() || this->service().isEmpty() || this->path().isEmpty())
             return QDBusPendingCall::fromError(this->lastError());

        QDBusMessage msg = QDBusMessage::createMethodCall(this->service(),
                                                          this->path(),
                                                          dbusInterfaceProperties(),
                                                          QStringLiteral("Get"));
        msg << this->interface() << method;
        return this->connection().asyncCall(msg, this->timeout());
    }